

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

void __thiscall nonius::standard_reporter::~standard_reporter(standard_reporter *this)

{
  ~standard_reporter(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

std::string description() override {
            return "the standard reporter";
        }